

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_read_fraction(yang_type *typ,uint32_t value)

{
  uint32_t value_local;
  yang_type *typ_local;
  
  if ((typ->base == LY_TYPE_DER) || (typ->base == LY_TYPE_DEC64)) {
    typ->base = LY_TYPE_DEC64;
    if ((typ->type->info).dec64.dig == '\0') {
      if ((value != 0) && (value < 0x13)) {
        (typ->type->info).dec64.dig = (uint8_t)value;
        return 0;
      }
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Invalid value \"%d\" of \"%s\".",(ulong)value,
              "fraction-digits");
    }
    else {
      ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,"fraction-digits","type");
    }
  }
  else {
    ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unexpected fraction-digits statement.");
  }
  return 1;
}

Assistant:

int
yang_read_fraction(struct yang_type *typ, uint32_t value)
{
    if (typ->base == 0 || typ->base == LY_TYPE_DEC64) {
        typ->base = LY_TYPE_DEC64;
    } else {
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Unexpected fraction-digits statement.");
        goto error;
    }
    if (typ->type->info.dec64.dig) {
        LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, "fraction-digits", "type");
        goto error;
    }
    /* range check */
    if (value < 1 || value > 18) {
        LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Invalid value \"%d\" of \"%s\".", value, "fraction-digits");
        goto error;
    }
    typ->type->info.dec64.dig = value;
    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}